

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_file_client.cpp
# Opt level: O2

void __thiscall SendFile::Send(SendFile *this,Handle *handle)

{
  element_type *peVar1;
  int iVar2;
  char buf [4096];
  undefined1 auStack_1018 [4096];
  
  do {
    if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
      return;
    }
    std::istream::read((char *)this,(long)auStack_1018);
    peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = (*peVar1->_vptr_CNSocket[5])(peVar1,auStack_1018,(ulong)*(uint *)&this->field_0x8);
  } while ((char)iVar2 != '\0');
  this->_block = true;
  return;
}

Assistant:

void Send(const Handle& handle) {
        char buf[__read_len];
        while (!_file.eof()) {
            _file.read(buf, __read_len);
            int len =  (int)_file.gcount();
            if (!handle->Write(buf, len)) {
                _block = true;
                return;
            }
        }
    }